

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timestamp.cpp
# Opt level: O1

TimestampCastResult
duckdb::Timestamp::TryConvertTimestampTZ
          (char *str,idx_t len,timestamp_t *result,bool *has_offset,string_t *tz,
          optional_ptr<int,_true> nanos)

{
  byte bVar1;
  char *pcVar2;
  idx_t iVar3;
  string_t *psVar4;
  DateCastResult DVar5;
  bool bVar6;
  int64_t iVar7;
  TimestampCastResult TVar8;
  char *__src;
  ulong uVar9;
  uint uVar10;
  ulong uVar11;
  date_t date;
  int ss;
  int mm;
  int hh;
  idx_t time_pos;
  dtime_t time;
  idx_t local_78;
  timestamp_t *local_70;
  date_t local_64;
  undefined4 local_60;
  undefined4 uStack_5c;
  undefined4 local_58;
  int local_54;
  int local_50;
  int local_4c;
  string_t *local_48;
  idx_t local_40;
  dtime_t local_38;
  
  *has_offset = false;
  local_70 = result;
  DVar5 = Date::TryConvertDate(str,len,&local_78,&local_64,has_offset,false);
  if (DVar5 == ERROR_INCORRECT_FORMAT) {
    return ERROR_INCORRECT_FORMAT;
  }
  if (DVar5 == ERROR_RANGE) {
    return ERROR_RANGE;
  }
  if (local_78 == len) {
    if (local_64.days == -0x7fffffff) {
      iVar7 = -0x7fffffffffffffff;
    }
    else {
      if (local_64.days != 0x7fffffff) {
        bVar6 = TryFromDatetime(local_64,(dtime_t)0x0,local_70);
        return !bVar6 * '\x03';
      }
      iVar7 = 0x7fffffffffffffff;
    }
    local_70->value = iVar7;
    return SUCCESS;
  }
  if ((str[local_78] == 'T') || (str[local_78] == ' ')) {
    local_78 = local_78 + 1;
  }
  iVar3 = local_78;
  local_40 = 0;
  local_48 = tz;
  bVar6 = Time::TryConvertInternal(str + local_78,len - local_78,&local_40,&local_38,false,nanos);
  if (!bVar6) {
    return ERROR_INCORRECT_FORMAT;
  }
  if (86400000000 < local_38.micros) {
    return ERROR_RANGE;
  }
  uVar9 = iVar3 + local_40;
  local_78 = uVar9;
  bVar6 = TryFromDatetime(local_64,local_38,local_70);
  if (!bVar6) {
    return ERROR_RANGE;
  }
  if (len <= uVar9) {
    return SUCCESS;
  }
  if (str[uVar9] == 'Z') {
    local_78 = uVar9 + 1;
LAB_0131cc56:
    *has_offset = true;
  }
  else {
    bVar6 = TryParseUTCOffset(str,&local_78,len,&local_4c,&local_50,&local_54);
    psVar4 = local_48;
    if (bVar6) {
      bVar6 = TrySubtractOperator::Operation<long,long,long>
                        (local_70->value,
                         (long)local_54 * 1000000 +
                         (long)local_50 * 60000000 + (long)local_4c * 3600000000,&local_70->value);
      if (!bVar6) {
        TVar8 = ERROR_RANGE;
LAB_0131cdac:
        bVar6 = false;
        goto LAB_0131cdae;
      }
      goto LAB_0131cc56;
    }
    uVar9 = local_78 + 1;
    if (str[local_78] != ' ') {
      TVar8 = ERROR_NON_UTC_TIMEZONE;
      goto LAB_0131cdac;
    }
    local_78 = uVar9;
    uVar11 = uVar9;
    if (uVar9 < len) {
      do {
        bVar1 = str[uVar11];
        if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
           ((local_78 = uVar11, 0x34 < bVar1 - 0x2b ||
            ((0x10000000000015U >> ((ulong)(bVar1 - 0x2b) & 0x3f) & 1) == 0)))) break;
        uVar11 = uVar11 + 1;
        local_78 = len;
      } while (len != uVar11);
    }
    if (local_78 - uVar9 != 0) {
      __src = str + uVar9;
      uVar10 = (uint)(local_78 - uVar9);
      if (uVar10 < 0xd) {
        local_58 = 0;
        local_60 = 0;
        uStack_5c = 0;
        pcVar2 = (char *)0x0;
        if (uVar10 != 0) {
          switchD_012dd528::default(&local_60,__src,(ulong)(uVar10 & 0xf));
          pcVar2 = (char *)CONCAT44(local_58,uStack_5c);
        }
      }
      else {
        local_60 = *(undefined4 *)__src;
        pcVar2 = __src;
      }
      local_58 = (undefined4)((ulong)pcVar2 >> 0x20);
      uStack_5c = SUB84(pcVar2,0);
      (psVar4->value).pointer.length = uVar10;
      *(ulong *)((long)&psVar4->value + 4) = CONCAT44(uStack_5c,local_60);
      *(undefined4 *)((long)&psVar4->value + 0xc) = local_58;
    }
  }
  TVar8 = ERROR_RANGE;
  bVar6 = len <= local_78;
  if (!bVar6) {
    do {
      if ((4 < (byte)str[local_78] - 9) && (str[local_78] != 0x20)) {
        TVar8 = ERROR_INCORRECT_FORMAT;
        break;
      }
      local_78 = local_78 + 1;
      bVar6 = len <= local_78;
    } while (local_78 != len);
  }
LAB_0131cdae:
  if (bVar6) {
    return SUCCESS;
  }
  return TVar8;
}

Assistant:

TimestampCastResult Timestamp::TryConvertTimestampTZ(const char *str, idx_t len, timestamp_t &result, bool &has_offset,
                                                     string_t &tz, optional_ptr<int32_t> nanos) {
	idx_t pos;
	date_t date;
	dtime_t time;
	has_offset = false;
	switch (Date::TryConvertDate(str, len, pos, date, has_offset)) {
	case DateCastResult::ERROR_INCORRECT_FORMAT:
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	case DateCastResult::ERROR_RANGE:
		return TimestampCastResult::ERROR_RANGE;
	default:
		break;
	}
	if (pos == len) {
		// no time: only a date or special
		if (date == date_t::infinity()) {
			result = timestamp_t::infinity();
			return TimestampCastResult::SUCCESS;
		} else if (date == date_t::ninfinity()) {
			result = timestamp_t::ninfinity();
			return TimestampCastResult::SUCCESS;
		}
		return Timestamp::TryFromDatetime(date, dtime_t(0), result) ? TimestampCastResult::SUCCESS
		                                                            : TimestampCastResult::ERROR_RANGE;
	}
	// try to parse a time field
	if (str[pos] == ' ' || str[pos] == 'T') {
		pos++;
	}
	idx_t time_pos = 0;
	// TryConvertTime may recursively call us, so we opt for a stricter
	// operation. Note that we can't pass strict== true here because we
	// want to process any suffix.
	if (!Time::TryConvertInterval(str + pos, len - pos, time_pos, time, false, nanos)) {
		return TimestampCastResult::ERROR_INCORRECT_FORMAT;
	}
	//	We parsed an interval, so make sure it is in range.
	if (time.micros > Interval::MICROS_PER_DAY) {
		return TimestampCastResult::ERROR_RANGE;
	}
	pos += time_pos;
	if (!Timestamp::TryFromDatetime(date, time, result)) {
		return TimestampCastResult::ERROR_RANGE;
	}
	if (pos < len) {
		// skip a "Z" at the end (as per the ISO8601 specs)
		int hh, mm, ss;
		if (str[pos] == 'Z') {
			pos++;
			has_offset = true;
		} else if (Timestamp::TryParseUTCOffset(str, pos, len, hh, mm, ss)) {
			const int64_t delta =
			    hh * Interval::MICROS_PER_HOUR + mm * Interval::MICROS_PER_MINUTE + ss * Interval::MICROS_PER_SEC;
			if (!TrySubtractOperator::Operation(result.value, delta, result.value)) {
				return TimestampCastResult::ERROR_RANGE;
			}
			has_offset = true;
		} else {
			// Parse a time zone: / [A-Za-z0-9/_]+/
			if (str[pos++] != ' ') {
				return TimestampCastResult::ERROR_NON_UTC_TIMEZONE;
			}
			auto tz_name = str + pos;
			for (; pos < len && CharacterIsTimeZone(str[pos]); ++pos) {
				continue;
			}
			auto tz_len = str + pos - tz_name;
			if (tz_len) {
				tz = string_t(tz_name, UnsafeNumericCast<uint32_t>(tz_len));
			}
			// Note that the caller must reinterpret the instant we return to the given time zone
		}

		// skip any spaces at the end
		while (pos < len && StringUtil::CharacterIsSpace(str[pos])) {
			pos++;
		}
		if (pos < len) {
			return TimestampCastResult::ERROR_INCORRECT_FORMAT;
		}
	}
	return TimestampCastResult::SUCCESS;
}